

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ActivationParams::clear_NonlinearityType(ActivationParams *this)

{
  NonlinearityTypeCase NVar1;
  ActivationParams *this_local;
  
  NVar1 = NonlinearityType_case(this);
  switch(NVar1) {
  case NONLINEARITYTYPE_NOT_SET:
    break;
  case kLinear:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kReLU:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kLeakyReLU:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kThresholdedReLU:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kPReLU:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kTanh:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kScaledTanh:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSigmoid:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSigmoidHard:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kELU:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSoftsign:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kSoftplus:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    break;
  case kParametricSoftplus:
    if ((this->NonlinearityType_).linear_ != (ActivationLinear *)0x0) {
      (*(((this->NonlinearityType_).linear_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void ActivationParams::clear_NonlinearityType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ActivationParams)
  switch (NonlinearityType_case()) {
    case kLinear: {
      delete NonlinearityType_.linear_;
      break;
    }
    case kReLU: {
      delete NonlinearityType_.relu_;
      break;
    }
    case kLeakyReLU: {
      delete NonlinearityType_.leakyrelu_;
      break;
    }
    case kThresholdedReLU: {
      delete NonlinearityType_.thresholdedrelu_;
      break;
    }
    case kPReLU: {
      delete NonlinearityType_.prelu_;
      break;
    }
    case kTanh: {
      delete NonlinearityType_.tanh_;
      break;
    }
    case kScaledTanh: {
      delete NonlinearityType_.scaledtanh_;
      break;
    }
    case kSigmoid: {
      delete NonlinearityType_.sigmoid_;
      break;
    }
    case kSigmoidHard: {
      delete NonlinearityType_.sigmoidhard_;
      break;
    }
    case kELU: {
      delete NonlinearityType_.elu_;
      break;
    }
    case kSoftsign: {
      delete NonlinearityType_.softsign_;
      break;
    }
    case kSoftplus: {
      delete NonlinearityType_.softplus_;
      break;
    }
    case kParametricSoftplus: {
      delete NonlinearityType_.parametricsoftplus_;
      break;
    }
    case NONLINEARITYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = NONLINEARITYTYPE_NOT_SET;
}